

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall
dynet::Model::serialize<boost::archive::text_oarchive>(Model *this,text_oarchive *ar,uint param_2)

{
  boost::archive::detail::save_non_pointer_type<boost::archive::text_oarchive>::save_standard::
  invoke<std::vector<dynet::ParameterStorageBase*,std::allocator<dynet::ParameterStorageBase*>>>
            (ar,&this->all_params);
  boost::archive::detail::save_non_pointer_type<boost::archive::text_oarchive>::save_standard::
  invoke<std::vector<dynet::ParameterStorage*,std::allocator<dynet::ParameterStorage*>>>
            (ar,&this->params);
  boost::archive::detail::save_non_pointer_type<boost::archive::text_oarchive>::save_standard::
  invoke<std::vector<dynet::LookupParameterStorage*,std::allocator<dynet::LookupParameterStorage*>>>
            (ar,&this->lookup_params);
  boost::archive::detail::save_non_pointer_type<boost::archive::text_oarchive>::save_standard::
  invoke<dynet::L2WeightDecay>(ar,&this->weight_decay);
  boost::archive::detail::save_non_pointer_type<boost::archive::text_oarchive>::save_standard::
  invoke<std::vector<unsigned_int,std::allocator<unsigned_int>>>(ar,&this->updated_params);
  boost::archive::detail::save_non_pointer_type<boost::archive::text_oarchive>::save_standard::
  invoke<std::vector<unsigned_int,std::allocator<unsigned_int>>>(ar,&this->updated_lookup_params);
  return;
}

Assistant:

void Model::serialize(Archive& ar, const unsigned int) {
  ar & all_params;
  ar & params;
  ar & lookup_params;
  ar & weight_decay;
  // TODO do we want to save these or not?
  ar & updated_params;
  ar & updated_lookup_params;
}